

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O1

bool __thiscall IntElemDomain<0,_4,_0>::propagate(IntElemDomain<0,_4,_0> *this)

{
  uint *puVar1;
  IntVar *pIVar2;
  int *piVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  IntVar *pIVar9;
  _func_int **pp_Var10;
  int iVar11;
  int iVar12;
  Tchar *pTVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  uint *puVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  int iVar22;
  IntView<0> *pIVar23;
  Tint *pTVar24;
  long lVar25;
  ulong uVar26;
  TrailElem local_48;
  IntVar *local_38;
  
  pIVar9 = (this->y).var;
  iVar15 = (pIVar9->min).v;
  lVar25 = (long)iVar15;
  iVar11 = (pIVar9->max).v;
  bVar21 = iVar11 < iVar15;
  if (iVar15 <= iVar11) {
    do {
      if (((pIVar9->min).v <= lVar25) &&
         ((pIVar9->vals == (Tchar *)0x0 || (pIVar9->vals[lVar25].v != '\0')))) {
        pTVar24 = this->num_support;
        puVar1 = (uint *)this->support[lVar25];
        uVar6 = pTVar24[lVar25].v;
        if ((int)uVar6 < 1) {
          uVar7 = 0;
LAB_001a6dbd:
          if (uVar7 == uVar6) {
            if (so.lazy == true) {
              pIVar9 = (this->x).var;
              iVar11 = ((pIVar9->max).v - (pIVar9->min).v) + 4;
              local_48.pt = (int *)malloc((long)iVar11 * 4 + 8);
              ((Tint *)local_48.pt)->v = (((Tint *)local_48.pt)->v & 0xfcU) + iVar11 * 0x100 + 2;
              vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)&local_48);
              pTVar24 = (Tint *)local_48.pt;
              iVar11 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
              if ((uint)*&pTVar24->v < 0x200) {
LAB_001a72ec:
                abort();
              }
              ((Tint *)(&pTVar24->v + 2))->v = iVar11;
              iVar11 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
              if ((uint)*&pTVar24->v < 0x300) goto LAB_001a72ec;
              ((Tint *)(&pTVar24->v + 3))->v = iVar11;
              pIVar9 = (this->x).var;
              iVar15 = (pIVar9->min).v;
              iVar5 = (pIVar9->max).v;
              iVar12 = (this->x).b;
              iVar11 = iVar12 + iVar15;
              if (iVar11 <= iVar12 + iVar5) {
                iVar15 = iVar15 + iVar12 + 3;
                uVar14 = (long)iVar11;
                do {
                  iVar11 = (pIVar9->min).v;
                  iVar22 = (iVar15 - iVar12) - iVar11;
                  lVar16 = uVar14 - (long)iVar12;
                  if (((iVar5 < lVar16) || (lVar16 < iVar11)) ||
                     ((pIVar9->vals != (Tchar *)0x0 &&
                      (pIVar9->vals[uVar14 - (long)iVar12].v == '\0')))) {
                    pp_Var10 = (pIVar9->super_Var).super_Branching._vptr_Branching;
                  }
                  else {
                    pIVar9 = (this->a).data[uVar14 & 0xffffffff].var;
                    pp_Var10 = (pIVar9->super_Var).super_Branching._vptr_Branching;
                    lVar16 = lVar25;
                  }
                  uVar6 = (*pp_Var10[0xd])(pIVar9,lVar16,0);
                  if ((int)((uint)*&pTVar24->v >> 8) <= iVar22) goto LAB_001a72ec;
                  ((Tint *)(&pTVar24->v + (long)iVar22 + 1))->v = uVar6 ^ 1;
                  pIVar9 = (this->x).var;
                  iVar5 = (pIVar9->max).v;
                  iVar12 = (this->x).b;
                  iVar15 = iVar15 + 1;
                  bVar4 = (long)uVar14 < (long)(iVar12 + iVar5);
                  uVar14 = uVar14 + 1;
                } while (bVar4);
              }
            }
            else {
              pTVar24 = (Tint *)0x0;
            }
            pIVar9 = (this->y).var;
            bVar4 = true;
            iVar11 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0x11])
                               (pIVar9,lVar25,pTVar24,1);
            if ((char)iVar11 == '\0') goto LAB_001a6fe8;
          }
          else {
            uVar14 = (ulong)uVar7;
            if (0 < (int)uVar7) {
              piVar3 = this->temp_sup;
              uVar26 = 0;
              do {
                piVar3[uVar26] = puVar1[uVar26];
                uVar26 = uVar26 + 1;
              } while (uVar14 != uVar26);
            }
            pTVar24 = pTVar24 + lVar25;
            iVar11 = pTVar24->v;
            puVar17 = puVar1;
            uVar26 = uVar14;
            if ((int)uVar7 < iVar11) {
              do {
                *puVar17 = puVar17[uVar14];
                uVar26 = uVar26 + 1;
                iVar11 = pTVar24->v;
                puVar17 = puVar17 + 1;
              } while ((long)uVar26 < (long)iVar11);
            }
            if (0 < (int)uVar7) {
              piVar3 = this->temp_sup;
              uVar26 = 0;
              do {
                puVar1[(long)(int)(iVar11 - uVar7) + uVar26] = piVar3[uVar26];
                uVar26 = uVar26 + 1;
              } while (uVar14 != uVar26);
            }
            local_48.x = pTVar24->v;
            iVar11 = local_48.x - uVar7;
            local_48.sz = 4;
            local_48.pt = &pTVar24->v;
            vec<TrailElem>::push(&engine.trail,&local_48);
            pTVar24->v = iVar11;
          }
          bVar4 = false;
        }
        else {
          lVar16 = (long)(this->x).b;
          lVar20 = (int)*puVar1 - lVar16;
          pIVar9 = (this->x).var;
          lVar18 = (long)(pIVar9->min).v;
          lVar19 = (long)(pIVar9->max).v;
          if ((((lVar20 < lVar18) || (lVar19 < lVar20)) ||
              ((pIVar9->vals != (Tchar *)0x0 && (pIVar9->vals[lVar20].v == '\0')))) ||
             ((pIVar2 = (this->a).data[*puVar1].var, lVar25 < (pIVar2->min).v ||
              ((pIVar2->max).v < lVar25)))) {
LAB_001a6d3d:
            uVar14 = 1;
            if (1 < (int)uVar6) {
              uVar14 = (ulong)uVar6;
            }
            uVar26 = 0;
            do {
              lVar20 = (int)puVar1[uVar26] - lVar16;
              if ((((lVar18 <= lVar20) && (lVar20 <= lVar19)) &&
                  ((pIVar9->vals == (Tchar *)0x0 || (pIVar9->vals[lVar20].v != '\0')))) &&
                 (((pIVar2 = (this->a).data[puVar1[uVar26]].var, (pIVar2->min).v <= lVar25 &&
                   (lVar25 <= (pIVar2->max).v)) &&
                  ((pIVar2->vals == (Tchar *)0x0 || (pIVar2->vals[lVar25].v != '\0')))))) {
                uVar14 = uVar26 & 0xffffffff;
                break;
              }
              uVar26 = uVar26 + 1;
            } while (uVar14 != uVar26);
            uVar7 = (uint)uVar14;
            goto LAB_001a6dbd;
          }
          bVar4 = false;
          if ((pIVar2->vals != (Tchar *)0x0) && (pIVar2->vals[lVar25].v == '\0')) goto LAB_001a6d3d;
        }
LAB_001a6fe8:
        if (bVar4) {
          if (!bVar21) {
            return false;
          }
          break;
        }
      }
      pIVar9 = (this->y).var;
      lVar16 = (long)(pIVar9->max).v;
      bVar21 = lVar16 <= lVar25;
      bVar4 = lVar25 < lVar16;
      lVar25 = lVar25 + 1;
    } while (bVar4);
  }
  pIVar9 = (this->x).var;
  iVar11 = (pIVar9->min).v;
  if (iVar11 != (pIVar9->max).v) {
    return true;
  }
  uVar6 = (this->x).b + iVar11;
  pIVar23 = (this->a).data;
  pIVar9 = pIVar23[uVar6].var;
  iVar11 = (pIVar9->min).v;
  if ((((this->y).var)->min).v < iVar11) {
    if (so.lazy == true) {
      iVar15 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[8])();
      uVar7 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
      uVar14 = (ulong)uVar7 << 0x20 | (long)iVar15 << 2 | 3;
    }
    else {
      uVar14 = 0;
    }
    pIVar9 = (this->y).var;
    iVar11 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0xe])
                       (pIVar9,(long)iVar11,uVar14,1);
    if ((char)iVar11 == '\0') {
      return false;
    }
  }
  pIVar23 = pIVar23 + uVar6;
  pIVar9 = (this->y).var;
  iVar11 = (pIVar9->min).v;
  if ((pIVar23->var->min).v < iVar11) {
    if (so.lazy == true) {
      iVar15 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[8])();
      uVar7 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
      uVar14 = (ulong)uVar7 << 0x20 | (long)iVar15 << 2 | 3;
    }
    else {
      uVar14 = 0;
    }
    iVar11 = (*(pIVar23->var->super_Var).super_Branching._vptr_Branching[0xe])
                       (pIVar23->var,(long)iVar11,uVar14,1);
    if ((char)iVar11 == '\0') {
      return false;
    }
  }
  iVar11 = (pIVar23->var->max).v;
  if (iVar11 < (((this->y).var)->max).v) {
    if (so.lazy == true) {
      iVar15 = (*(pIVar23->var->super_Var).super_Branching._vptr_Branching[9])();
      uVar7 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
      uVar14 = (ulong)uVar7 << 0x20 | (long)iVar15 << 2 | 3;
    }
    else {
      uVar14 = 0;
    }
    pIVar9 = (this->y).var;
    iVar11 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0xf])
                       (pIVar9,(long)iVar11,uVar14,1);
    if ((char)iVar11 == '\0') {
      return false;
    }
  }
  pIVar9 = (this->y).var;
  iVar11 = (pIVar9->max).v;
  if (iVar11 < (pIVar23->var->max).v) {
    if (so.lazy == true) {
      iVar15 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[9])();
      uVar7 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
      uVar14 = (ulong)uVar7 << 0x20 | (long)iVar15 << 2 | 3;
    }
    else {
      uVar14 = 0;
    }
    iVar11 = (*(pIVar23->var->super_Var).super_Branching._vptr_Branching[0xf])
                       (pIVar23->var,(long)iVar11,uVar14,1);
    if ((char)iVar11 == '\0') {
      return false;
    }
  }
  pIVar23 = (this->a).data;
  pIVar9 = pIVar23[uVar6].var;
  iVar11 = (pIVar9->min).v;
  local_38 = pIVar9;
  do {
    iVar15 = -0x80000000;
    lVar25 = (long)iVar11;
    if (iVar11 != (pIVar9->max).v) {
      pTVar13 = pIVar9->vals + lVar25;
      iVar15 = iVar11;
      do {
        pTVar13 = pTVar13 + 1;
        iVar15 = iVar15 + 1;
      } while (pTVar13->v == '\0');
    }
    pIVar2 = (this->y).var;
    if (((iVar11 < (pIVar2->min).v) || ((pIVar2->max).v < iVar11)) ||
       ((pIVar2->vals != (Tchar *)0x0 && (pIVar2->vals[lVar25].v == '\0')))) {
      if (so.lazy == true) {
        uVar7 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[0xd])(pIVar2,lVar25,0);
        pIVar9 = (this->x).var;
        uVar8 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0xd])
                          (pIVar9,(long)(int)uVar6 - (long)(this->x).b,1);
        uVar14 = (ulong)(uVar8 ^ 1) << 0x20 | (long)(int)(uVar7 ^ 1) << 2 | 3;
        pIVar9 = local_38;
      }
      else {
        uVar14 = 0;
      }
      iVar11 = (*((pIVar23[uVar6].var)->super_Var).super_Branching._vptr_Branching[0x11])
                         (pIVar23[uVar6].var,lVar25,uVar14,1);
      if ((char)iVar11 == '\0') {
        return false;
      }
    }
    pIVar23 = (this->a).data;
    iVar11 = iVar15;
  } while( true );
}

Assistant:

bool propagate() override {
		// propagate holes in y
		for (int v = static_cast<int>(y.getMin()); v <= static_cast<int>(y.getMax()); v++) {
			if (!y.indomain(v)) {
				continue;
			}
			int* s = support[v];
			int f = 0;
			if (num_support[v] > 0) {
				if (x.indomain(s[0]) && a[s[0]].indomain(v)) {
					continue;
				}
				while (!(x.indomain(s[f]) && a[s[f]].indomain(v)) && ++f < num_support[v]) {
					;
				}
			}
			if (f == num_support[v]) {
				// v has no support, remove from y
				Clause* r = nullptr;
				if (so.lazy) {
					r = Reason_new(static_cast<int>(x.getMax() + 4 - x.getMin()));
					(*r)[1] = x.getMinLit();
					(*r)[2] = x.getMaxLit();
					for (int i = static_cast<int>(x.getMin()); i <= static_cast<int>(x.getMax()); i++) {
						const int reasonIndex = static_cast<int>(3 + i - x.getMin());
						if (x.indomain(i)) {
							const Lit l = ~a[i].getLit(v, LR_NE);
							(*r)[reasonIndex] = l;
						} else {
							const Lit l = ~x.getLit(i, LR_NE);
							(*r)[reasonIndex] = l;
						}
					}
				}
				if (!y.remVal(v, r)) {
					return false;
				}
			} else {
				// shift bad supports to back
				for (int i = 0; i < f; i++) {
					temp_sup[i] = s[i];
				}
				for (int i = f; i < num_support[v]; i++) {
					s[i - f] = s[i];
				}
				s += num_support[v] - f;
				for (int i = 0; i < f; i++) {
					s[i] = temp_sup[i];
				}
				num_support[v] -= f;
			}
		}

		// propagate holes in x
		// just ignore

		// propagate holes in a_i
		if (x.isFixed()) {
			const int v = static_cast<int>(x.getVal());
			const IntView<W>& f = a[v];
			setDom(y, setMin, f.getMin(), f.getMinLit(), x.getValLit());
			setDom(f, setMin, y.getMin(), y.getMinLit(), x.getValLit());
			setDom(y, setMax, f.getMax(), f.getMaxLit(), x.getValLit());
			setDom(f, setMax, y.getMax(), y.getMaxLit(), x.getValLit());
			for (typename IntView<W>::iterator i = a[v].begin(); i != a[v].end();) {
				const int w = *i++;
				if (!y.indomain(w) &&
						!a[v].remVal(w,
												 so.lazy ? Reason(~y.getLit(w, LR_NE), ~x.getLit(v, LR_EQ)) : Reason())) {
					return false;
				}
			}
		}

		return true;
	}